

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_stack.h
# Opt level: O2

void uo_stack_insert_arr(uo_stack *stack,int index,void **items,size_t count)

{
  uint64_t n;
  size_t sVar1;
  uint64_t uVar2;
  void **ppvVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  byte bVar7;
  
  bVar7 = 0;
  ppvVar3 = stack->items;
  sVar1 = stack->count;
  n = sVar1 + 0x10;
  sVar6 = sVar1;
  if (stack->capacity < n) {
    uVar2 = next_power_of_two(n);
    stack->capacity = uVar2;
    ppvVar3 = (void **)realloc(ppvVar3,uVar2 * 8);
    stack->items = ppvVar3;
    sVar6 = stack->count;
  }
  lVar4 = (long)(int)((index >> 0x1f & (uint)sVar1) + index);
  memmove(ppvVar3 + lVar4 + 0x10,ppvVar3 + lVar4,(sVar6 - lVar4) * 8);
  ppvVar3 = stack->items + lVar4;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *ppvVar3 = *items;
    items = items + (ulong)bVar7 * -2 + 1;
    ppvVar3 = ppvVar3 + (ulong)bVar7 * -2 + 1;
  }
  stack->count = n;
  return;
}

Assistant:

static inline void uo_stack_insert_arr(
    uo_stack *stack,
    int index,
    void *const *items,
    size_t count)
{
    index = index >= 0 ? index : (stack->count + index);
    size_t stack_count = count + stack->count;

    if (stack_count > stack->capacity)
        stack->items = realloc(stack->items, sizeof *stack->items * (stack->capacity = next_power_of_two(stack_count)));

    memmove(stack->items + index + count, stack->items + index, sizeof *stack->items * (stack->count - index));
    memcpy(stack->items + index, items, sizeof *items * count);
    stack->count = stack_count;
}